

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resSat.c
# Opt level: O2

void * Res_SatSimulateConstr(Abc_Ntk_t *pAig,int fOnSet)

{
  uint nNodes;
  long lVar1;
  Vec_Ptr_t *p;
  void **ppvVar2;
  Abc_Obj_t *pAVar3;
  Vec_Ptr_t *p_00;
  Abc_Obj_t *pAVar4;
  void *pvVar5;
  sat_solver *pSat;
  long *plVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  
  p = (Vec_Ptr_t *)malloc(0x10);
  p->nCap = 8;
  p->nSize = 0;
  ppvVar2 = (void **)malloc(0x40);
  p->pArray = ppvVar2;
  pAVar3 = Abc_NtkPo(pAig,0);
  Vec_PtrPush(p,pAVar3);
  pAVar3 = Abc_NtkPo(pAig,1);
  Vec_PtrPush(p,pAVar3);
  nNodes = p->nSize;
  p_00 = Abc_NtkDfsNodes(pAig,(Abc_Obj_t **)p->pArray,nNodes);
  pAVar3 = Abc_AigConst1(pAig);
  (pAVar3->field_6).pTemp = (void *)0x0;
  for (pAVar3 = (Abc_Obj_t *)0x1; iVar7 = (int)pAVar3 + -1, iVar7 < pAig->vPis->nSize;
      pAVar3 = (Abc_Obj_t *)((long)&pAVar3->pNtk + 1)) {
    pAVar4 = Abc_NtkPi(pAig,iVar7);
    (pAVar4->field_6).pCopy = pAVar3;
  }
  for (iVar7 = 0; iVar7 < p_00->nSize; iVar7 = iVar7 + 1) {
    pvVar5 = Vec_PtrEntry(p_00,iVar7);
    *(Abc_Obj_t **)((long)pvVar5 + 0x40) = pAVar3;
    pAVar3 = (Abc_Obj_t *)((long)&pAVar3->pNtk + 1);
  }
  uVar8 = 0;
  uVar9 = (ulong)nNodes;
  if ((int)nNodes < 1) {
    uVar9 = uVar8;
  }
  for (; (int)uVar9 != (int)uVar8; uVar8 = uVar8 + 1) {
    pvVar5 = Vec_PtrEntry(p,(int)uVar8);
    *(ulong *)((long)pvVar5 + 0x40) = (long)&pAVar3->pNtk + uVar8;
  }
  pSat = sat_solver_new();
  pAVar3 = Abc_AigConst1(pAig);
  Res_SatAddConst1(pSat,(pAVar3->field_6).iTemp,0);
  for (iVar7 = 0; iVar7 < p_00->nSize; iVar7 = iVar7 + 1) {
    plVar6 = (long *)Vec_PtrEntry(p_00,iVar7);
    lVar1 = *(long *)(*(long *)(*plVar6 + 0x20) + 8);
    Res_SatAddAnd(pSat,(int)plVar6[8],
                  *(int *)(*(long *)(lVar1 + (long)*(int *)plVar6[4] * 8) + 0x40),
                  *(int *)(*(long *)(lVar1 + (long)((int *)plVar6[4])[1] * 8) + 0x40),
                  *(uint *)((long)plVar6 + 0x14) >> 10 & 1,*(uint *)((long)plVar6 + 0x14) >> 0xb & 1
                 );
  }
  Vec_PtrFree(p_00);
  pAVar3 = Abc_NtkPo(pAig,0);
  Res_SatAddEqual(pSat,(pAVar3->field_6).iTemp,
                  *(int *)((long)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanins).pArray] + 0x40),
                  *(uint *)&pAVar3->field_0x14 >> 10 & 1);
  pAVar3 = Abc_NtkPo(pAig,1);
  Res_SatAddEqual(pSat,(pAVar3->field_6).iTemp,
                  *(int *)((long)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanins).pArray] + 0x40),
                  *(uint *)&pAVar3->field_0x14 >> 10 & 1);
  pAVar3 = Abc_NtkPo(pAig,0);
  Res_SatAddConst1(pSat,(pAVar3->field_6).iTemp,0);
  pAVar3 = Abc_NtkPo(pAig,1);
  Res_SatAddConst1(pSat,(pAVar3->field_6).iTemp,(uint)(fOnSet == 0));
  Vec_PtrFree(p);
  return pSat;
}

Assistant:

void * Res_SatSimulateConstr( Abc_Ntk_t * pAig, int fOnSet )
{
    sat_solver * pSat;
    Vec_Ptr_t * vFanins;
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj;
    int i, nNodes;

    // start the array
    vFanins = Vec_PtrAlloc( 2 );
    pObj = Abc_NtkPo( pAig, 0 );
    Vec_PtrPush( vFanins, pObj );
    pObj = Abc_NtkPo( pAig, 1 );
    Vec_PtrPush( vFanins, pObj );

    // collect reachable nodes
    vNodes = Abc_NtkDfsNodes( pAig, (Abc_Obj_t **)vFanins->pArray, vFanins->nSize );

    // assign unique numbers to each node
    nNodes = 0;
    Abc_AigConst1(pAig)->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)nNodes++;
    Abc_NtkForEachPi( pAig, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)nNodes++;
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)nNodes++;
    Vec_PtrForEachEntry( Abc_Obj_t *, vFanins, pObj, i ) // useful POs
        pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)nNodes++;

    // start the solver
    pSat = sat_solver_new();

    // add clause for the constant node
    Res_SatAddConst1( pSat, (int)(ABC_PTRUINT_T)Abc_AigConst1(pAig)->pCopy, 0 );
    // add clauses for AND gates
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        Res_SatAddAnd( pSat, (int)(ABC_PTRUINT_T)pObj->pCopy, 
            (int)(ABC_PTRUINT_T)Abc_ObjFanin0(pObj)->pCopy, (int)(ABC_PTRUINT_T)Abc_ObjFanin1(pObj)->pCopy, Abc_ObjFaninC0(pObj), Abc_ObjFaninC1(pObj) );
    Vec_PtrFree( vNodes );
    // add clauses for the first PO
    pObj = Abc_NtkPo( pAig, 0 );
    Res_SatAddEqual( pSat, (int)(ABC_PTRUINT_T)pObj->pCopy, 
        (int)(ABC_PTRUINT_T)Abc_ObjFanin0(pObj)->pCopy, Abc_ObjFaninC0(pObj) );
    // add clauses for the second PO
    pObj = Abc_NtkPo( pAig, 1 );
    Res_SatAddEqual( pSat, (int)(ABC_PTRUINT_T)pObj->pCopy, 
        (int)(ABC_PTRUINT_T)Abc_ObjFanin0(pObj)->pCopy, Abc_ObjFaninC0(pObj) );

    // add trivial clauses
    pObj = Abc_NtkPo( pAig, 0 );
    Res_SatAddConst1( pSat, (int)(ABC_PTRUINT_T)pObj->pCopy, 0 ); // care-set

    pObj = Abc_NtkPo( pAig, 1 );
    Res_SatAddConst1( pSat, (int)(ABC_PTRUINT_T)pObj->pCopy, !fOnSet ); // on-set

    Vec_PtrFree( vFanins );
    return pSat;
}